

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O3

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,128ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  char cVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  basic_string<char> *pbVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  plVar2 = *(long **)this;
  uVar3 = *(ulong *)(first + 0x3f8);
  uVar4 = plVar2[1];
  uVar9 = uVar4;
  if (uVar3 < uVar4) {
    uVar9 = uVar3;
  }
  if (uVar9 != 0) {
    uVar8 = 0;
    uVar11 = 1;
    do {
      cVar1 = *(char *)(*(long *)(first + 0x3f0) + uVar8);
      if (cVar1 < *(char *)(*plVar2 + uVar8)) goto LAB_00187405;
      if (*(char *)(*plVar2 + uVar8) < cVar1) goto LAB_00187458;
      bVar5 = uVar11 < uVar9;
      uVar8 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar5);
  }
  if (uVar3 < uVar4) {
LAB_00187405:
    uVar3 = *(ulong *)(first + 0x5f8);
    uVar9 = uVar4;
    if (uVar3 < uVar4) {
      uVar9 = uVar3;
    }
    if (uVar9 != 0) {
      uVar10 = 1;
      uVar8 = 0;
      do {
        cVar1 = *(char *)(*(long *)(first + 0x5f0) + uVar8);
        if (cVar1 < *(char *)(*plVar2 + uVar8)) goto LAB_0018744a;
        if (*(char *)(*plVar2 + uVar8) < cVar1) goto LAB_001874a5;
        uVar8 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar8 < uVar9);
    }
    if (uVar3 < uVar4) {
LAB_0018744a:
      pbVar6 = doitfirst<frozen::basic_string<char>const*,32ul>(this,first + 0x600);
      return pbVar6;
    }
LAB_001874a5:
    first = first + 0x400;
  }
  else {
LAB_00187458:
    uVar3 = *(ulong *)(first + 0x1f8);
    uVar9 = uVar4;
    if (uVar3 < uVar4) {
      uVar9 = uVar3;
    }
    if (uVar9 != 0) {
      lVar7 = 0;
      uVar8 = 0;
      uVar11 = 1;
      do {
        cVar1 = *(char *)(*(long *)(first + 0x1f0) + uVar8);
        if (cVar1 < *(char *)(*plVar2 + uVar8)) goto LAB_0018749e;
        if (*(char *)(*plVar2 + uVar8) < cVar1) goto LAB_001874b0;
        bVar5 = uVar11 < uVar9;
        uVar8 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar5);
    }
    if (uVar3 < uVar4) {
LAB_0018749e:
      lVar7 = 0x200;
    }
    else {
      lVar7 = 0;
    }
LAB_001874b0:
    first = first + lVar7;
  }
  pbVar6 = doit_fast<frozen::basic_string<char>const*,31ul>(this,first);
  return pbVar6;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }